

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWRaster.cpp
# Opt level: O0

void __thiscall
TRM::SWRaster::sweep_hline(SWRaster *this,int32_t x,int32_t y,int32_t area,int32_t count)

{
  bool bVar1;
  int *piVar2;
  undefined1 local_48 [8];
  Span span;
  value_type *p_span;
  int local_28;
  uint local_24;
  int32_t local_20;
  int32_t coverage;
  int32_t count_local;
  int32_t area_local;
  int32_t y_local;
  int32_t x_local;
  SWRaster *this_local;
  
  local_24 = area >> 9;
  if ((int)local_24 < 0) {
    local_24 = -local_24;
  }
  if ((this->even_odd & 1U) == 0) {
    if (0xff < (int)local_24) {
      local_24 = 0xff;
    }
  }
  else {
    local_24 = local_24 & 0x1ff;
    if (local_24 < 0x101) {
      if (local_24 == 0x100) {
        local_24 = 0xff;
      }
    }
    else {
      local_24 = 0x200 - local_24;
    }
  }
  local_20 = count;
  coverage = area;
  count_local = y;
  area_local = x;
  _y_local = this;
  local_28 = std::numeric_limits<int>::max();
  piVar2 = std::min<int>(&area_local,&local_28);
  area_local = *piVar2;
  p_span._4_4_ = std::numeric_limits<int>::max();
  piVar2 = std::min<int>(&count_local,(int *)((long)&p_span + 4));
  count_local = *piVar2;
  if (local_24 != 0) {
    bVar1 = std::vector<TRM::Span,_std::allocator<TRM::Span>_>::empty(&this->m_spans);
    if ((((bVar1) ||
         (span._8_8_ = std::vector<TRM::Span,_std::allocator<TRM::Span>_>::back(&this->m_spans),
         ((reference)span._8_8_)->y != count_local)) ||
        (((reference)span._8_8_)->x + ((reference)span._8_8_)->len != area_local)) ||
       (((reference)span._8_8_)->cover != local_24)) {
      local_48._0_4_ = area_local;
      local_48._4_4_ = count_local;
      span.x = local_20;
      span.y = local_24;
      std::vector<TRM::Span,std::allocator<TRM::Span>>::emplace_back<TRM::Span&>
                ((vector<TRM::Span,std::allocator<TRM::Span>> *)&this->m_spans,(Span *)local_48);
    }
    else {
      ((reference)span._8_8_)->len = ((reference)span._8_8_)->len + local_20;
    }
  }
  return;
}

Assistant:

void SWRaster::sweep_hline(int32_t x, int32_t y, int32_t area, int32_t count) {
  /* compute the coverage line's coverage, depending on the    */
  /* outline fill rule                                         */
  /*                                                           */
  /* the coverage percentage is area/(PIXEL_BITS*PIXEL_BITS*2) */
  /*                                                           */
  int32_t coverage = static_cast<int32_t>(area >> (PIXEL_BITS * 2 + 1 - 8));
  // use range [0, 256]
  if (coverage < 0) {
    coverage = -coverage;
  }

  if (this->even_odd) {
    coverage &= 511;
    if (coverage > 256)
      coverage = 512 - coverage;
    else if (coverage == 256)
      coverage = 255;
  } else {
    if (coverage >= 256) coverage = 255;
  }

  x = std::min(x, std::numeric_limits<int32_t>::max());
  y = std::min(y, std::numeric_limits<int32_t>::max());

  if (coverage) {
    if (!m_spans.empty()) {
      auto p_span = &m_spans.back();
      if (p_span->y == y && p_span->x + p_span->len == x &&
          p_span->cover == coverage) {
        p_span->len = p_span->len + count;
        return;
      }
    }

    Span span;
    span.x = x;
    span.y = y;
    span.len = count;
    span.cover = coverage;

    m_spans.emplace_back(span);
  }
}